

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::LipidTransVisitor::update(LipidTransVisitor *this)

{
  undefined4 *puVar1;
  StuntDouble *pSVar2;
  DirectionalAtom *pDVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  uint i_3;
  long lVar7;
  double *pdVar8;
  uint i;
  long lVar9;
  double *pdVar10;
  uint j;
  double (*__return_storage_ptr__) [3];
  undefined4 uVar11;
  double tmp;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Vector3d zaxis;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  MultipoleAdapter ma;
  Vector3<double> result_4;
  undefined8 local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  double local_f8;
  double local_e8 [10];
  Vector3d local_98;
  double local_78 [3];
  MultipoleAdapter local_60;
  double local_58 [9];
  
  pSVar2 = this->refSd_;
  lVar9 = *(long *)((long)&(pSVar2->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar2->storage_);
  local_78[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)pSVar2->localIndex_ * 0x18);
  pdVar8 = (double *)(lVar9 + (long)pSVar2->localIndex_ * 0x18);
  local_78[0] = *pdVar8;
  local_78[1] = pdVar8[1];
  pDVar3 = this->originDatom_;
  lVar9 = *(long *)((long)&(((pDVar3->super_Atom).super_StuntDouble.snapshotMan_)->currentSnapshot_
                           ->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (pDVar3->super_Atom).super_StuntDouble.storage_);
  lVar7 = (long)(pDVar3->super_Atom).super_StuntDouble.localIndex_;
  pdVar8 = (double *)(lVar9 + lVar7 * 0x18);
  dVar4 = *pdVar8;
  dVar5 = pdVar8[1];
  (this->origin_).super_Vector<double,_3U>.data_[2] = *(double *)(lVar9 + 0x10 + lVar7 * 0x18);
  (this->origin_).super_Vector<double,_3U>.data_[0] = dVar4;
  (this->origin_).super_Vector<double,_3U>.data_[1] = dVar5;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar9 = 0;
  do {
    local_e8[lVar9] = local_78[lVar9] - (this->origin_).super_Vector<double,_3U>.data_[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_98.super_Vector<double,_3U>.data_[2] = local_e8[2];
  local_98.super_Vector<double,_3U>.data_[0] = local_e8[0];
  local_98.super_Vector<double,_3U>.data_[1] = local_e8[1];
  Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_98);
  local_60.at_ = (this->originDatom_->super_Atom).atomType_;
  local_128 = 0.0;
  uStack_120 = 0.0;
  local_118 = 0.0;
  bVar6 = MultipoleAdapter::isDipole(&local_60);
  if (bVar6) {
    pDVar3 = this->originDatom_;
    lVar9 = *(long *)((long)&(((pDVar3->super_Atom).super_StuntDouble.snapshotMan_)->
                              currentSnapshot_->atomData).dipole.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (pDVar3->super_Atom).super_StuntDouble.storage_);
    lVar7 = (long)(pDVar3->super_Atom).super_StuntDouble.localIndex_;
    local_118 = *(double *)(lVar9 + 0x10 + lVar7 * 0x18);
    puVar1 = (undefined4 *)(lVar9 + lVar7 * 0x18);
    uVar11 = *puVar1;
    uVar12 = puVar1[1];
    uVar13 = puVar1[2];
    uVar14 = puVar1[3];
  }
  else {
    __return_storage_ptr__ = (double (*) [3])local_58;
    StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,(StuntDouble *)this->originDatom_);
    pdVar8 = local_e8;
    local_e8[6] = 0.0;
    local_e8[7] = 0.0;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[8] = 0.0;
    lVar9 = 0;
    do {
      lVar7 = 0;
      pdVar10 = pdVar8;
      do {
        *pdVar10 = (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                   super_RectMatrix<double,_3U,_3U>).data_[0][lVar7];
        lVar7 = lVar7 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar7 != 3);
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 1;
      __return_storage_ptr__ = __return_storage_ptr__ + 1;
    } while (lVar9 != 3);
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0.0;
    pdVar8 = local_e8;
    lVar9 = 0;
    do {
      dVar4 = (double)(&local_108)[lVar9];
      lVar7 = 0;
      do {
        dVar4 = dVar4 + *(double *)((long)pdVar8 + lVar7) * *(double *)((long)&OpenMD::V3Z + lVar7);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      (&local_108)[lVar9] = dVar4;
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar9 != 3);
    local_118 = local_f8;
    uVar11 = (undefined4)local_108;
    uVar12 = local_108._4_4_;
    uVar13 = (undefined4)uStack_100;
    uVar14 = uStack_100._4_4_;
  }
  local_128 = (double)CONCAT44(uVar12,uVar11);
  uStack_120 = (double)CONCAT44(uVar14,uVar13);
  local_e8[0] = local_98.super_Vector<double,_3U>.data_[1] * local_118 -
                local_98.super_Vector<double,_3U>.data_[2] * uStack_120;
  local_e8[1] = local_98.super_Vector<double,_3U>.data_[2] * local_128 -
                local_98.super_Vector<double,_3U>.data_[0] * local_118;
  local_e8[2] = local_98.super_Vector<double,_3U>.data_[0] * uStack_120 -
                local_128 * local_98.super_Vector<double,_3U>.data_[1];
  local_58[0] = local_e8[2] * uStack_120 - local_e8[1] * local_118;
  local_58[1] = local_e8[0] * local_118 - local_e8[2] * local_128;
  local_58[2] = local_e8[1] * local_128 - local_e8[0] * uStack_120;
  dVar4 = 0.0;
  lVar9 = 0;
  do {
    dVar4 = dVar4 + local_e8[lVar9] * local_e8[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  lVar9 = 0;
  do {
    local_e8[lVar9] = local_e8[lVar9] / dVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  dVar4 = 0.0;
  lVar9 = 0;
  do {
    dVar4 = dVar4 + local_58[lVar9] * local_58[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  lVar9 = 0;
  do {
    local_58[lVar9] = local_58[lVar9] / dVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  dVar4 = 0.0;
  lVar9 = 0;
  do {
    dVar4 = dVar4 + (double)(&local_128)[lVar9] * (double)(&local_128)[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  lVar9 = 0;
  do {
    (&local_128)[lVar9] = (double)(&local_128)[lVar9] / dVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       local_e8[2];
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       local_e8[0];
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       local_e8[1];
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       local_58[0];
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       local_58[1];
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
       local_58[2];
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
       local_128;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       uStack_120;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       local_118;
  return;
}

Assistant:

void LipidTransVisitor::update() {
    Vector3d ref = refSd_->getPos();
    origin_      = originDatom_->getPos();
    Vector3d v1  = ref - origin_;
    info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

    MultipoleAdapter ma = MultipoleAdapter(originDatom_->getAtomType());
    Vector3d zaxis;
    if (ma.isDipole()) {
      zaxis = originDatom_->getDipole();
    } else {
      zaxis = originDatom_->getA().transpose() * V3Z;
    }

    Vector3d xaxis = cross(v1, zaxis);
    Vector3d yaxis = cross(zaxis, xaxis);

    xaxis.normalize();
    yaxis.normalize();
    zaxis.normalize();

    rotMat_.setRow(0, xaxis);
    rotMat_.setRow(1, yaxis);
    rotMat_.setRow(2, zaxis);
  }